

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O1

string * __thiscall
DifferentialEquation::getParameter
          (string *__return_storage_ptr__,DifferentialEquation *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  StochasticVariable *pSVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  stringstream term;
  stringstream param;
  string local_390;
  string *local_370;
  string *local_368;
  long *local_360;
  long local_358;
  long local_350 [2];
  char *local_340;
  long local_338;
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_368 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar6 = std::__cxx11::string::compare((char *)name);
  if (iVar6 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"d ",2);
    pcVar2 = (this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
             parametricName._M_dataplus._M_p;
    local_340 = local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_340,pcVar2,
               pcVar2 + (this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                        parametricName._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_340,local_338);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    if (local_340 != local_330) {
      operator_delete(local_340,local_330._0_8_ + 1);
    }
    iVar6 = 0;
    while (iVar6 < this->eqnTermAmount) {
      if (iVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," + ",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"f",1);
      iVar6 = iVar6 + 1;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      pcVar2 = (this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
               parametricName._M_dataplus._M_p;
      local_340 = local_330;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,pcVar2,
                 pcVar2 + (this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                          parametricName._M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_340,local_338);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
      if (local_340 != local_330) {
        operator_delete(local_340,local_330._0_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"d X",3);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      std::ostream::_M_insert<double>(this->eqnX0);
    }
    else {
      local_370 = name;
      iVar6 = std::__cxx11::string::compare((char *)name);
      if (iVar6 == 0) {
        bVar14 = (code *)this->eqnMethodPtr == stepEulerIto;
        bVar5 = *(long *)&this->field_0x158 == 0;
        pcVar9 = "stratonovitch";
        if (bVar14 && bVar5) {
          pcVar9 = "ito";
        }
        lVar8 = 0xd;
        if (bVar14 && bVar5) {
          lVar8 = 3;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar8);
      }
      else {
        if ((this->eqnIntegrands).
            super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->eqnIntegrands).
            super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          paVar1 = &local_390.field_2;
          uVar10 = 1;
          uVar13 = 0;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"f",1);
            uVar12 = (ulong)uVar10;
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
            pcVar2 = (this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                     parametricName._M_dataplus._M_p;
            local_390._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_390,pcVar2,
                       pcVar2 + (this->super_StochasticVariable).super_StochasticProcess.
                                super_Parametric.parametricName._M_string_length);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_390._M_dataplus._M_p,local_390._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != paVar1) {
              operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            sVar3 = local_370->_M_string_length;
            if (sVar3 == local_390._M_string_length) {
              if (sVar3 == 0) {
                bVar14 = true;
              }
              else {
                iVar6 = bcmp((local_370->_M_dataplus)._M_p,local_390._M_dataplus._M_p,sVar3);
                bVar14 = iVar6 == 0;
              }
            }
            else {
              bVar14 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != paVar1) {
              operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar14) {
              Parametric::getConfiguration_abi_cxx11_
                        (&local_390,
                         (Parametric *)
                         (this->eqnIntegrands).
                         super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_390._M_dataplus._M_p,local_390._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != paVar1) {
                operator_delete(local_390._M_dataplus._M_p,
                                local_390.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
              std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
              if (bVar14) break;
            }
            else {
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
              std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
            }
            uVar10 = uVar10 + 1;
            uVar13 = uVar12;
          } while (uVar12 < (ulong)((long)(this->eqnIntegrands).
                                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->eqnIntegrands).
                                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if ((this->eqnIntegrands).
            super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->eqnIntegrands).
            super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar13 = 1;
          uVar12 = 0;
          do {
            uVar11 = uVar13;
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"X",1);
            std::ostream::_M_insert<unsigned_long>((ulong)local_330);
            std::__cxx11::stringbuf::str();
            sVar3 = local_370->_M_string_length;
            if (sVar3 == local_390._M_string_length) {
              if (sVar3 == 0) {
                bVar14 = true;
              }
              else {
                iVar6 = bcmp((local_370->_M_dataplus)._M_p,local_390._M_dataplus._M_p,sVar3);
                bVar14 = iVar6 == 0;
              }
            }
            else {
              bVar14 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != &local_390.field_2) {
              operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar14) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
              pSVar4 = (this->eqnIntegrators).
                       super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12];
              local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
              pcVar2 = (pSVar4->super_StochasticProcess).super_Parametric.parametricName._M_dataplus
                       ._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_390,pcVar2,
                         pcVar2 + *(size_type *)
                                   ((long)&(pSVar4->super_StochasticProcess).super_Parametric.
                                           parametricName + 8));
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_390._M_dataplus._M_p,
                                  local_390._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
              pSVar4 = (this->eqnIntegrators).
                       super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12];
              pcVar2 = (pSVar4->super_StochasticProcess).super_Parametric.parametricType._M_dataplus
                       ._M_p;
              local_360 = local_350;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_360,pcVar2,
                         pcVar2 + *(size_type *)
                                   ((long)&(pSVar4->super_StochasticProcess).super_Parametric.
                                           parametricType + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_360,local_358)
              ;
              if (local_360 != local_350) {
                operator_delete(local_360,local_350[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != &local_390.field_2) {
                operator_delete(local_390._M_dataplus._M_p,
                                local_390.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
              std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
              if (bVar14) break;
            }
            else {
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
              std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
            }
            uVar13 = (ulong)((int)uVar11 + 1);
            uVar12 = uVar11;
          } while (uVar11 < (ulong)((long)(this->eqnIntegrands).
                                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->eqnIntegrands).
                                          super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_368;
}

Assistant:

string DifferentialEquation::getParameter( const string& name ) const
{
	stringstream param;
	
	// formula
	if (name=="equation") {
		param << "d " << getName() << " = ";
		for (int i=0; i<eqnTermAmount; ++i) {
			if (i) param << " + ";
			param << "f" << i+1 << "(" << getName() << ") ";
			param << "d X" << i+1 << " ";
		}
	}
	
	// first value
	else if (name=="starting-value")
		param << getStartingValue();
	
	// mode
	else if (name=="mode")
		param << (isIto() ? "ito" : "stratonovitch");
	
	// parameters for single terms
	else {
		
		// parameters for integrands
		for (uint i=0; i<eqnIntegrands.size(); ++i) {
			stringstream term;
			term << "f" << i+1 << "(" << getName() << ")";
			if (name == term.str()) {
				param << eqnIntegrands[i]->getConfiguration();
				break;
			}
		}
			
		// parameters for integrators
		for (uint i=0; i<eqnIntegrands.size(); ++i) {
			stringstream term;
			term << "X" << i+1;
			if (name == term.str()) {
				param << "\"" << eqnIntegrators[i]->getName() << "\" " << eqnIntegrators[i]->getType();
				break;
			}
		}
	}
	
	return param.str();
}